

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O1

void __thiscall
google::
dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
::advance_past_empty_and_deleted
          (dense_hashtable_iterator<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
           *this)

{
  int iVar1;
  dense_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *pdVar2;
  pointer ppVar3;
  int iVar4;
  int iVar5;
  
  ppVar3 = this->pos;
  if (ppVar3 != this->end) {
    pdVar2 = this->ht;
    iVar5 = (pdVar2->key_info).super_TransparentHasher.super_Hasher.num_compares_;
    iVar1 = (pdVar2->key_info).empty_key.first;
    do {
      iVar4 = iVar5 + 1;
      if ((iVar1 != -ppVar3->first) &&
         ((pdVar2->num_deleted == 0 ||
          (iVar4 = iVar5 + 2, (pdVar2->key_info).delkey.first != -ppVar3->first)))) break;
      iVar5 = iVar4;
      ppVar3 = ppVar3 + 1;
      this->pos = ppVar3;
      iVar4 = iVar5;
    } while (ppVar3 != this->end);
    (pdVar2->key_info).super_TransparentHasher.super_Hasher.num_compares_ = iVar4;
  }
  return;
}

Assistant:

void advance_past_empty_and_deleted() {
    while (pos != end && (ht->test_empty(*this) || ht->test_deleted(*this)))
      ++pos;
  }